

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall glu::Texture1D::upload(Texture1D *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  TestError *this_00;
  TextureFormat *pTVar8;
  TransferFormat TVar9;
  ConstPixelBufferAccess *pCVar10;
  void *pvVar11;
  undefined1 local_60 [8];
  ConstPixelBufferAccess access;
  int levelNdx;
  deUint32 dStack_28;
  TransferFormat transferFormat;
  Functions *gl;
  Texture1D *this_local;
  long lVar7;
  
  iVar3 = (*this->m_context->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 && (this->m_glTexture != 0))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      (**(code **)(lVar7 + 0xb8))(0xde0,this->m_glTexture);
      pcVar1 = *(code **)(lVar7 + 0xff0);
      pTVar8 = tcu::TextureLevelPyramid::getFormat(&(this->m_refTexture).super_TextureLevelPyramid);
      iVar3 = computePixelStore(pTVar8);
      (*pcVar1)(0xcf5,iVar3);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      checkError(dVar5,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x57);
      pTVar8 = tcu::TextureLevelPyramid::getFormat(&(this->m_refTexture).super_TextureLevelPyramid);
      unique0x00012000 = *pTVar8;
      TVar9 = getTransferFormat(unique0x00012000);
      for (access.m_data._0_4_ = 0; iVar3 = (int)access.m_data,
          iVar6 = tcu::TextureLevelPyramid::getNumLevels
                            (&(this->m_refTexture).super_TextureLevelPyramid), iVar3 < iVar6;
          access.m_data._0_4_ = (int)access.m_data + 1) {
        bVar2 = tcu::TextureLevelPyramid::isLevelEmpty
                          (&(this->m_refTexture).super_TextureLevelPyramid,(int)access.m_data);
        if (!bVar2) {
          pCVar10 = &tcu::TextureLevelPyramid::getLevel
                               (&(this->m_refTexture).super_TextureLevelPyramid,(int)access.m_data)
                     ->super_ConstPixelBufferAccess;
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_60,pCVar10);
          iVar3 = (int)access.m_data;
          pcVar1 = *(code **)(lVar7 + 0x1308);
          dVar5 = this->m_format;
          iVar6 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_60);
          dStack_28 = TVar9.dataType;
          pvVar11 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)local_60);
          (*pcVar1)(0xde0,iVar3,dVar5,iVar6,0,(ulong)TVar9 & 0xffffffff,dStack_28,pvVar11);
        }
      }
      dVar5 = (**(code **)(lVar7 + 0x800))();
      checkError(dVar5,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,100);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x54);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void Texture1D::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_1D, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
	{
		if (m_refTexture.isLevelEmpty(levelNdx))
			continue; // Don't upload.

		tcu::ConstPixelBufferAccess access = m_refTexture.getLevel(levelNdx);
		gl.texImage1D(GL_TEXTURE_1D, levelNdx, m_format, access.getWidth(), 0 /* border */, transferFormat.format, transferFormat.dataType, access.getDataPtr());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}